

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O2

void __thiscall
Test<unsigned_int,unsigned_int,double>::
Test<unsigned_int(*)(unsigned_int),unsigned_int(*)(unsigned_int)>
          (Test<unsigned_int,unsigned_int,double> *this,string *suiteName,
          input_generator_t *inputGenerator,input_range_t inputRange,uint64_t samplesInRange,
          _func_uint_uint *refFunc,_func_uint_uint *dummyFunc)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  uint_fast64_t j;
  long lVar4;
  uint_fast64_t i;
  ulong uVar5;
  double local_50;
  Test<unsigned_int,unsigned_int,double> *local_48;
  Test<unsigned_int,unsigned_int,double> *local_40;
  input_range_t local_38;
  
  local_38 = inputRange;
  std::__cxx11::string::string((string *)this,(string *)suiteName);
  *(input_range_t *)(this + 0x20) = inputRange;
  local_48 = this + 0x28;
  std::
  function<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_(const_std::pair<unsigned_int,_unsigned_int>_&,_unsigned_long)>
  ::operator()((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,inputGenerator,
               &local_38,samplesInRange);
  local_40 = this + 0x40;
  *(undefined8 *)(this + 0x50) = 0;
  *(undefined8 *)(this + 0x58) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined4 *)(this + 0x60) = 0;
  lVar3 = *(long *)(this + 0x28);
  lVar2 = lVar3;
  for (uVar5 = 0; uVar5 < (ulong)(*(long *)(this + 0x30) - lVar2 >> 2); uVar5 = uVar5 + 1) {
    uVar1 = (*refFunc)(*(uint *)(lVar3 + uVar5 * 4));
    local_50 = (double)uVar1;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              ((vector<double,_std::allocator<double>_> *)local_40,&local_50);
    lVar2 = *(long *)local_48;
  }
  local_50 = 0.0;
  lVar2 = std::chrono::_V2::system_clock::now();
  for (lVar4 = 0; lVar4 != 10000; lVar4 = lVar4 + 1) {
    for (uVar5 = 0; uVar5 < (ulong)(*(long *)(this + 0x30) - *(long *)(this + 0x28) >> 2);
        uVar5 = uVar5 + 1) {
      uVar1 = (*dummyFunc)(*(uint *)(lVar3 + uVar5 * 4));
      local_50 = (double)uVar1;
    }
  }
  lVar3 = std::chrono::_V2::system_clock::now();
  *(ulong *)(this + 0x58) = (ulong)(lVar3 - lVar2) / 10000;
  return;
}

Assistant:

Test(const std::string& suiteName, input_generator_t inputGenerator, input_range_t inputRange, uint64_t samplesInRange, ReferenceFunction refFunc, DummyFunction dummyFunc)
        : m_suiteName(suiteName), m_inputRange(inputRange), m_inputValues(inputGenerator(inputRange, samplesInRange))
    {
        // generate reference result values
        const input_t* inputData = m_inputValues.data();
        for (uint_fast64_t i = 0; i < m_inputValues.size(); ++i)
        {
            m_referenceValues.push_back(refFunc(inputData[i]));
        }
        // make sure we use a volatile destination, so values are not thrown away.
        volatile storage_t dummy{};
        // "calibrate" the speed loop
        auto startCalib = std::chrono::high_resolution_clock::now();
        for (uint_fast64_t j = 0; j < LOOPCOUNT; ++j)
        {
            for (uint_fast64_t i = 0; i < m_inputValues.size(); ++i)
            {
                dummy = dummyFunc(inputData[i]);
            }
        }
        auto overheadDuration = std::chrono::high_resolution_clock::now() - startCalib;
        m_overheadNs = std::chrono::duration_cast<std::chrono::nanoseconds>(overheadDuration).count() / LOOPCOUNT;
    }